

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O0

Primer * __thiscall ASDCP::MXF::Primer::InsertTag(Primer *this,MDDEntry *Entry,TagValue *Tag)

{
  byte_t bVar1;
  bool bVar2;
  h__PrimerLookup *phVar3;
  map<ASDCP::UL,_ASDCP::TagValue,_std::less<ASDCP::UL>,_std::allocator<std::pair<const_ASDCP::UL,_ASDCP::TagValue>_>_>
  *pmVar4;
  reference ppVar5;
  TagValue *in_RCX;
  pair<std::_Rb_tree_const_iterator<ASDCP::MXF::Primer::LocalTagEntry>,_bool> pVar6;
  pair<const_ASDCP::UL,_ASDCP::TagValue> local_d0;
  _Base_ptr local_a8;
  undefined1 local_a0;
  undefined1 local_98 [8];
  LocalTagEntry TmpEntry;
  _Self local_50;
  iterator i;
  UL TestUL;
  TagValue *Tag_local;
  MDDEntry *Entry_local;
  Primer *this_local;
  
  phVar3 = ASDCP::mem_ptr::operator_cast_to_h__PrimerLookup_((mem_ptr *)&Entry[3].name);
  if (phVar3 != (h__PrimerLookup *)0x0) {
    UL::UL((UL *)&i,&Tag->a);
    pmVar4 = &mem_ptr<ASDCP::MXF::Primer::h__PrimerLookup>::operator->
                        ((mem_ptr<ASDCP::MXF::Primer::h__PrimerLookup> *)&Entry[3].name)->
              super_map<ASDCP::UL,_ASDCP::TagValue,_std::less<ASDCP::UL>,_std::allocator<std::pair<const_ASDCP::UL,_ASDCP::TagValue>_>_>
    ;
    local_50._M_node =
         (_Base_ptr)
         std::
         map<ASDCP::UL,_ASDCP::TagValue,_std::less<ASDCP::UL>,_std::allocator<std::pair<const_ASDCP::UL,_ASDCP::TagValue>_>_>
         ::find(pmVar4,(key_type *)&i);
    pmVar4 = &mem_ptr<ASDCP::MXF::Primer::h__PrimerLookup>::operator->
                        ((mem_ptr<ASDCP::MXF::Primer::h__PrimerLookup> *)&Entry[3].name)->
              super_map<ASDCP::UL,_ASDCP::TagValue,_std::less<ASDCP::UL>,_std::allocator<std::pair<const_ASDCP::UL,_ASDCP::TagValue>_>_>
    ;
    TmpEntry.UL.super_Identifier<16U>._24_8_ =
         std::
         map<ASDCP::UL,_ASDCP::TagValue,_std::less<ASDCP::UL>,_std::allocator<std::pair<const_ASDCP::UL,_ASDCP::TagValue>_>_>
         ::end(pmVar4);
    bVar2 = std::operator==(&local_50,(_Self *)(TmpEntry.UL.super_Identifier<16U>.m_Value + 0xf));
    if (bVar2) {
      if ((Tag[8].a == '\0') && (Tag[8].b == '\0')) {
        in_RCX->a = 0xff;
        bVar1 = Entry[4].ul[0];
        Entry[4].ul[0] = bVar1 + 0xff;
        in_RCX->b = bVar1;
      }
      else {
        in_RCX->a = Tag[8].a;
        in_RCX->b = Tag[8].b;
      }
      LocalTagEntry::LocalTagEntry((LocalTagEntry *)local_98);
      UL::operator=((UL *)&TmpEntry.Tag,(UL *)&i);
      TmpEntry.super_IArchive._vptr_IArchive._0_2_ = *in_RCX;
      pVar6 = std::
              set<ASDCP::MXF::Primer::LocalTagEntry,_std::less<ASDCP::MXF::Primer::LocalTagEntry>,_std::allocator<ASDCP::MXF::Primer::LocalTagEntry>_>
              ::insert((set<ASDCP::MXF::Primer::LocalTagEntry,_std::less<ASDCP::MXF::Primer::LocalTagEntry>,_std::allocator<ASDCP::MXF::Primer::LocalTagEntry>_>
                        *)&Entry[4].tag,(value_type *)local_98);
      local_a8 = (_Base_ptr)pVar6.first._M_node;
      local_a0 = pVar6.second;
      pmVar4 = &mem_ptr<ASDCP::MXF::Primer::h__PrimerLookup>::operator->
                          ((mem_ptr<ASDCP::MXF::Primer::h__PrimerLookup> *)&Entry[3].name)->
                super_map<ASDCP::UL,_ASDCP::TagValue,_std::less<ASDCP::UL>,_std::allocator<std::pair<const_ASDCP::UL,_ASDCP::TagValue>_>_>
      ;
      std::pair<const_ASDCP::UL,_ASDCP::TagValue>::pair<ASDCP::UL_&,_ASDCP::TagValue_&,_true>
                (&local_d0,(UL *)&TmpEntry.Tag,(TagValue *)&TmpEntry);
      std::
      map<ASDCP::UL,_ASDCP::TagValue,_std::less<ASDCP::UL>,_std::allocator<std::pair<const_ASDCP::UL,_ASDCP::TagValue>_>_>
      ::insert(pmVar4,&local_d0);
      std::pair<const_ASDCP::UL,_ASDCP::TagValue>::~pair(&local_d0);
      LocalTagEntry::~LocalTagEntry((LocalTagEntry *)local_98);
    }
    else {
      ppVar5 = std::_Rb_tree_iterator<std::pair<const_ASDCP::UL,_ASDCP::TagValue>_>::operator*
                         (&local_50);
      *in_RCX = ppVar5->second;
    }
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
    UL::~UL((UL *)&i);
    return this;
  }
  __assert_fail("m_Lookup",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/MXF.cpp",
                0x217,
                "virtual ASDCP::Result_t ASDCP::MXF::Primer::InsertTag(const MDDEntry &, ASDCP::TagValue &)"
               );
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::Primer::InsertTag(const MDDEntry& Entry, ASDCP::TagValue& Tag)
{
  assert(m_Lookup);
  UL TestUL(Entry.ul);
  std::map<UL, TagValue>::iterator i = m_Lookup->find(TestUL);

  if ( i == m_Lookup->end() )
    {
      if ( Entry.tag.a == 0 && Entry.tag.b == 0 )
	{
	  Tag.a = 0xff;
	  Tag.b = m_LocalTag--;
	}
      else
	{
	  Tag.a = Entry.tag.a;
	  Tag.b = Entry.tag.b;
	}

      LocalTagEntry TmpEntry;
      TmpEntry.UL = TestUL;
      TmpEntry.Tag = Tag;

      LocalTagEntryBatch.insert(TmpEntry);
      m_Lookup->insert(std::map<UL, TagValue>::value_type(TmpEntry.UL, TmpEntry.Tag));
    }
  else
    {
      Tag = (*i).second;
    }
   
  return RESULT_OK;
}